

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  byte bVar1;
  int iVar2;
  undefined1 *puVar3;
  long lVar4;
  char *pcVar5;
  byte *pbVar6;
  char *pcVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  void **ppvVar13;
  char *pcVar14;
  long lVar15;
  char *end;
  char syntax [200];
  char local_113 [3];
  void **local_110;
  char *local_108;
  arg_dstr_t local_100;
  char local_f8 [200];
  
  pbVar6 = (byte *)*argtable;
  local_110 = argtable;
  local_108 = suffix;
  if (pbVar6 == (byte *)0x0) {
    pcVar14 = " [-%c";
  }
  else {
    ppvVar13 = argtable + 1;
    pcVar5 = " -%c";
    pcVar14 = " [-%c";
    do {
      if ((*pbVar6 & 1) != 0) break;
      if ((0 < *(int *)(pbVar6 + 0x28)) &&
         ((char)((*pbVar6 & 2) >> 1) == '\0' && *(char **)(pbVar6 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar5,(ulong)(uint)(int)**(char **)(pbVar6 + 8));
        pcVar5 = "%c";
        pcVar14 = "[%c";
      }
      pbVar6 = (byte *)*ppvVar13;
      ppvVar13 = ppvVar13 + 1;
    } while (pbVar6 != (byte *)0x0);
  }
  pbVar6 = (byte *)*local_110;
  if (pbVar6 == (byte *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = "";
    ppvVar13 = local_110;
    do {
      ppvVar13 = ppvVar13 + 1;
      if ((*pbVar6 & 1) != 0) break;
      if ((*(int *)(pbVar6 + 0x28) < 1) &&
         ((char)((*pbVar6 & 2) >> 1) == '\0' && *(char **)(pbVar6 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar14,(ulong)(uint)(int)**(char **)(pbVar6 + 8));
        pcVar14 = "%c";
        pcVar5 = "]";
      }
      pbVar6 = (byte *)*ppvVar13;
    } while (pbVar6 != (byte *)0x0);
  }
  arg_dstr_catf(ds,"%s",pcVar5);
  pbVar6 = (byte *)*local_110;
  if (pbVar6 != (byte *)0x0) {
    lVar15 = 0;
    ppvVar13 = local_110;
    local_100 = ds;
    do {
      if ((*pbVar6 & 1) != 0) break;
      memset(local_f8,0,200);
      puVar3 = *(undefined1 **)(pbVar6 + 8);
      if ((puVar3 == (undefined1 *)0x0) || ((*pbVar6 & 2) != 0)) {
        lVar4 = *(long *)(pbVar6 + 0x18);
        bVar1 = *pbVar6;
        if (puVar3 == (undefined1 *)0x0) {
          pcVar14 = *(char **)(pbVar6 + 0x10);
          if (pcVar14 == (char *)0x0) {
            ppvVar13 = local_110;
            if (lVar4 != 0) {
              uVar9 = 0;
              if ((bVar1 & 4) == 0) {
                do {
                  if (local_f8[uVar9] == '\0') goto LAB_0010e889;
                  uVar9 = uVar9 + 1;
                } while (uVar9 != 0xc6);
                uVar9 = 0xc6;
LAB_0010e889:
                pcVar5 = local_f8 + uVar9;
                if (uVar9 < 0xc6) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14[lVar4] == '\0') goto LAB_0010e849;
                    pcVar5[(long)pcVar14] = pcVar14[lVar4];
                    pcVar14 = pcVar14 + 1;
                  } while ((char *)(0xc6 - uVar9) != pcVar14);
                  pcVar5 = local_f8 + 0xc6;
                }
              }
              else {
                do {
                  if (local_f8[uVar9] == '\0') goto LAB_0010ebc7;
                  uVar9 = uVar9 + 1;
                } while (uVar9 != 0xc6);
                uVar9 = 0xc6;
LAB_0010ebc7:
                pcVar14 = local_f8 + uVar9;
                if (uVar9 < 0xc6) {
                  lVar10 = 0;
                  do {
                    if (lVar10 == 1) break;
                    pcVar14[lVar10] = " ["[lVar10 + 1];
                    lVar10 = lVar10 + 1;
                  } while (0xc6 - uVar9 != lVar10);
                  pcVar14 = pcVar14 + lVar10;
                }
                *pcVar14 = '\0';
                pcVar5 = local_f8 + 0xc6;
                pcVar7 = pcVar14;
                if (pcVar14 < pcVar5) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar14);
                  do {
                    pcVar7 = pcVar14;
                    if (*pcVar14 == '\0') break;
                    pcVar14 = pcVar14 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar7 = pcVar5;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar7 < pcVar5) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14[lVar4] == '\0') break;
                    pcVar7[(long)pcVar14] = pcVar14[lVar4];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
                  pcVar7 = pcVar7 + (long)pcVar14;
                }
                *pcVar7 = '\0';
                pcVar14 = local_f8 + 0xc6;
                pcVar5 = pcVar7;
                if (pcVar7 < pcVar14) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar7);
                  do {
                    pcVar5 = pcVar7;
                    if (*pcVar7 == '\0') break;
                    pcVar7 = pcVar7 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar5 = pcVar14;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar5 < pcVar14) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14 == (char *)0x1) break;
                    pcVar5[(long)pcVar14] =
                         "Number of copies to be printed [default: 1]"[(long)(pcVar14 + 0x2a)];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar5) != pcVar14);
                  goto LAB_0010e849;
                }
              }
              goto LAB_0010e84c;
            }
          }
          else {
            uVar9 = 0;
            do {
              if (local_f8[uVar9] == '\0') goto LAB_0010e64d;
              uVar9 = uVar9 + 1;
            } while (uVar9 != 0xc6);
            uVar9 = 0xc6;
LAB_0010e64d:
            pcVar5 = local_f8 + uVar9;
            if (uVar9 < 0xc6) {
              lVar10 = 0;
              do {
                if (lVar10 == 2) break;
                pcVar5[lVar10] = "--"[lVar10];
                lVar10 = lVar10 + 1;
              } while (0xc6 - uVar9 != lVar10);
              pcVar5 = pcVar5 + lVar10;
            }
            *pcVar5 = '\0';
            pcVar11 = local_f8 + (199 - (long)pcVar5);
            pcVar7 = (char *)strcspn(pcVar14,",");
            if (pcVar11 <= pcVar7) {
              pcVar7 = pcVar11;
            }
            strncat(pcVar5,pcVar14,(size_t)pcVar7);
            ds = local_100;
            ppvVar13 = local_110;
            if (lVar4 != 0) {
              pcVar7 = pcVar5 + (long)(pcVar11 + -1);
              pcVar14 = pcVar5;
              if (pcVar5 < pcVar7) {
                pcVar11 = local_f8 + (0xc6 - (long)pcVar5);
                do {
                  pcVar14 = pcVar5;
                  if (*pcVar5 == '\0') break;
                  pcVar5 = pcVar5 + 1;
                  pcVar11 = pcVar11 + -1;
                  pcVar14 = pcVar7;
                } while (pcVar11 != (char *)0x0);
              }
              if (pcVar14 < pcVar7) {
                pcVar5 = (char *)0x0;
                do {
                  if (pcVar5 == (char *)0x1) break;
                  pcVar14[(long)pcVar5] = "="[(long)pcVar5];
                  pcVar5 = pcVar5 + 1;
                } while (local_f8 + (0xc6 - (long)pcVar14) != pcVar5);
                pcVar14 = pcVar14 + (long)pcVar5;
              }
              *pcVar14 = '\0';
              pcVar5 = local_f8 + 0xc6;
              if ((bVar1 & 4) == 0) {
                pcVar7 = pcVar14;
                if (pcVar14 < pcVar5) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar14);
                  do {
                    pcVar7 = pcVar14;
                    if (*pcVar14 == '\0') break;
                    pcVar14 = pcVar14 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar7 = pcVar5;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar7 < pcVar5) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14[lVar4] == '\0') break;
                    pcVar7[(long)pcVar14] = pcVar14[lVar4];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
LAB_0010eacb:
                  pcVar7 = pcVar7 + (long)pcVar14;
                }
              }
              else {
                pcVar7 = pcVar14;
                if (pcVar14 < pcVar5) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar14);
                  do {
                    pcVar7 = pcVar14;
                    if (*pcVar14 == '\0') break;
                    pcVar14 = pcVar14 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar7 = pcVar5;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar7 < pcVar5) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14 == (char *)0x1) break;
                    pcVar7[(long)pcVar14] = " ["[(long)(pcVar14 + 1)];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
                  pcVar7 = pcVar7 + (long)pcVar14;
                }
                *pcVar7 = '\0';
                pcVar14 = local_f8 + 0xc6;
                pcVar5 = pcVar7;
                if (pcVar7 < pcVar14) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar7);
                  do {
                    pcVar5 = pcVar7;
                    if (*pcVar7 == '\0') break;
                    pcVar7 = pcVar7 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar5 = pcVar14;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar5 < pcVar14) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14[lVar4] == '\0') break;
                    pcVar5[(long)pcVar14] = pcVar14[lVar4];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar5) != pcVar14);
                  pcVar5 = pcVar5 + (long)pcVar14;
                }
                *pcVar5 = '\0';
                pcVar14 = local_f8 + 0xc6;
                pcVar7 = pcVar5;
                if (pcVar5 < pcVar14) {
                  pcVar11 = local_f8 + (0xc6 - (long)pcVar5);
                  do {
                    pcVar7 = pcVar5;
                    if (*pcVar5 == '\0') break;
                    pcVar5 = pcVar5 + 1;
                    pcVar11 = pcVar11 + -1;
                    pcVar7 = pcVar14;
                  } while (pcVar11 != (char *)0x0);
                }
                if (pcVar7 < pcVar14) {
                  pcVar14 = (char *)0x0;
                  do {
                    if (pcVar14 == (char *)0x1) break;
                    pcVar7[(long)pcVar14] =
                         "Number of copies to be printed [default: 1]"[(long)(pcVar14 + 0x2a)];
                    pcVar14 = pcVar14 + 1;
                  } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
                  goto LAB_0010eacb;
                }
              }
              *pcVar7 = '\0';
            }
          }
        }
        else {
          local_113[0] = '-';
          local_113[1] = *puVar3;
          local_113[2] = 0;
          uVar9 = 0;
          do {
            if (local_f8[uVar9] == '\0') goto LAB_0010e5da;
            uVar9 = uVar9 + 1;
          } while (uVar9 != 0xc6);
          uVar9 = 0xc6;
LAB_0010e5da:
          pcVar14 = local_f8 + uVar9;
          if (uVar9 < 0xc6) {
            lVar10 = 0;
            do {
              if (local_113[lVar10] == '\0') {
                pcVar14 = pcVar14 + lVar10;
                goto LAB_0010e692;
              }
              pcVar14[lVar10] = local_113[lVar10];
              lVar10 = lVar10 + 1;
            } while (0xc6 - uVar9 != lVar10);
            pcVar14 = local_f8 + 0xc6;
          }
LAB_0010e692:
          *pcVar14 = '\0';
          if (lVar4 != 0) {
            pcVar5 = local_f8 + 0xc6;
            pcVar7 = pcVar14;
            if (pcVar14 < pcVar5) {
              pcVar11 = local_f8 + (0xc6 - (long)pcVar14);
              do {
                pcVar7 = pcVar14;
                if (*pcVar14 == '\0') break;
                pcVar14 = pcVar14 + 1;
                pcVar11 = pcVar11 + -1;
                pcVar7 = pcVar5;
              } while (pcVar11 != (char *)0x0);
            }
            if (pcVar7 < pcVar5) {
              pcVar14 = (char *)0x0;
              do {
                if (pcVar14 == (char *)0x1) break;
                pcVar7[(long)pcVar14] = "illegal value  "[(long)(pcVar14 + 0xe)];
                pcVar14 = pcVar14 + 1;
              } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
              pcVar7 = pcVar7 + (long)pcVar14;
            }
            *pcVar7 = '\0';
            pcVar14 = local_f8 + 0xc6;
            if ((bVar1 & 4) == 0) {
              pcVar5 = pcVar7;
              if (pcVar7 < pcVar14) {
                pcVar11 = local_f8 + (0xc6 - (long)pcVar7);
                do {
                  pcVar5 = pcVar7;
                  if (*pcVar7 == '\0') break;
                  pcVar7 = pcVar7 + 1;
                  pcVar11 = pcVar11 + -1;
                  pcVar5 = pcVar14;
                } while (pcVar11 != (char *)0x0);
              }
              if (pcVar5 < pcVar14) {
                pcVar14 = (char *)0x0;
                do {
                  if (pcVar14[lVar4] == '\0') break;
                  pcVar5[(long)pcVar14] = pcVar14[lVar4];
                  pcVar14 = pcVar14 + 1;
                } while (local_f8 + (0xc6 - (long)pcVar5) != pcVar14);
LAB_0010e849:
                pcVar5 = pcVar5 + (long)pcVar14;
              }
            }
            else {
              pcVar5 = pcVar7;
              if (pcVar7 < pcVar14) {
                pcVar11 = local_f8 + (0xc6 - (long)pcVar7);
                do {
                  pcVar5 = pcVar7;
                  if (*pcVar7 == '\0') break;
                  pcVar7 = pcVar7 + 1;
                  pcVar11 = pcVar11 + -1;
                  pcVar5 = pcVar14;
                } while (pcVar11 != (char *)0x0);
              }
              if (pcVar5 < pcVar14) {
                pcVar14 = (char *)0x0;
                do {
                  if (pcVar14 == (char *)0x1) break;
                  pcVar5[(long)pcVar14] = " ["[(long)(pcVar14 + 1)];
                  pcVar14 = pcVar14 + 1;
                } while (local_f8 + (0xc6 - (long)pcVar5) != pcVar14);
                pcVar5 = pcVar5 + (long)pcVar14;
              }
              *pcVar5 = '\0';
              pcVar14 = local_f8 + 0xc6;
              pcVar7 = pcVar5;
              if (pcVar5 < pcVar14) {
                pcVar11 = local_f8 + (0xc6 - (long)pcVar5);
                do {
                  pcVar7 = pcVar5;
                  if (*pcVar5 == '\0') break;
                  pcVar5 = pcVar5 + 1;
                  pcVar11 = pcVar11 + -1;
                  pcVar7 = pcVar14;
                } while (pcVar11 != (char *)0x0);
              }
              if (pcVar7 < pcVar14) {
                pcVar14 = (char *)0x0;
                do {
                  if (pcVar14[lVar4] == '\0') break;
                  pcVar7[(long)pcVar14] = pcVar14[lVar4];
                  pcVar14 = pcVar14 + 1;
                } while (local_f8 + (0xc6 - (long)pcVar7) != pcVar14);
                pcVar7 = pcVar7 + (long)pcVar14;
              }
              *pcVar7 = '\0';
              pcVar14 = local_f8 + 0xc6;
              pcVar5 = pcVar7;
              if (pcVar7 < pcVar14) {
                pcVar11 = local_f8 + (0xc6 - (long)pcVar7);
                do {
                  pcVar5 = pcVar7;
                  if (*pcVar7 == '\0') break;
                  pcVar7 = pcVar7 + 1;
                  pcVar11 = pcVar11 + -1;
                  pcVar5 = pcVar14;
                } while (pcVar11 != (char *)0x0);
              }
              if (pcVar5 < pcVar14) {
                pcVar14 = (char *)0x0;
                do {
                  if (pcVar14 == (char *)0x1) break;
                  pcVar5[(long)pcVar14] =
                       "Number of copies to be printed [default: 1]"[(long)(pcVar14 + 0x2a)];
                  pcVar14 = pcVar14 + 1;
                } while (local_f8 + (0xc6 - (long)pcVar5) != pcVar14);
                goto LAB_0010e849;
              }
            }
LAB_0010e84c:
            *pcVar5 = '\0';
          }
        }
        if (local_f8[0] != '\0') {
          pvVar8 = ppvVar13[lVar15];
          iVar2 = *(int *)((long)pvVar8 + 0x28);
          if (0 < iVar2) {
            iVar12 = 0;
            do {
              arg_dstr_cat(ds," ");
              arg_dstr_cat(ds,local_f8);
              iVar12 = iVar12 + 1;
              pvVar8 = ppvVar13[lVar15];
              iVar2 = *(int *)((long)pvVar8 + 0x28);
            } while (iVar12 < iVar2);
          }
          iVar12 = *(int *)((long)pvVar8 + 0x2c) - iVar2;
          if (*(int *)((long)pvVar8 + 0x2c) != iVar2) {
            pcVar14 = "]";
            if (iVar12 != 1) {
              if (iVar12 == 2) {
                arg_dstr_cat(ds," [");
                arg_dstr_cat(ds,local_f8);
                pcVar14 = "]";
                arg_dstr_cat(ds,"]");
              }
              else {
                pcVar14 = "]...";
              }
            }
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,local_f8);
            arg_dstr_cat(ds,pcVar14);
          }
        }
      }
      pbVar6 = (byte *)ppvVar13[lVar15 + 1];
      lVar15 = lVar15 + 1;
    } while (pbVar6 != (byte *)0x0);
  }
  if (local_108 != (char *)0x0) {
    arg_dstr_cat(ds,local_108);
  }
  return;
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}